

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

FStat * FStat::FindStat(char *name)

{
  int iVar1;
  FStat *pFVar2;
  
  pFVar2 = FirstStat;
  if (FirstStat != (FStat *)0x0) {
    do {
      iVar1 = strcasecmp(name,pFVar2->m_Name);
      if (iVar1 == 0) {
        return pFVar2;
      }
      pFVar2 = pFVar2->m_Next;
    } while (pFVar2 != (FStat *)0x0);
  }
  return pFVar2;
}

Assistant:

FStat *FStat::FindStat (const char *name)
{
	FStat *stat = FirstStat;

	while (stat && stricmp (name, stat->m_Name))
		stat = stat->m_Next;

	return stat;
}